

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
::rehash(sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>
  *pSVar1;
  EntryPointer begin;
  EntryPointer psVar2;
  int8_t iVar3;
  sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *result;
  size_t sVar4;
  ulong uVar5;
  sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *psVar6;
  long lVar7;
  byte bVar8;
  anon_union_16_1_a8c68091_for_sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>_3 *key;
  double dVar9;
  size_t local_38;
  
  local_38 = num_buckets;
  dVar9 = ceil((((double)CONCAT44(0x45300000,(int)(this->num_elements >> 0x20)) -
                1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this->num_elements) - 4503599627370496.0)) /
               (double)this->_max_load_factor);
  local_38 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 != 0) {
    iVar3 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
    sVar4 = this->num_slots_minus_one;
    if (sVar4 != 0) {
      sVar4 = sVar4 + 1;
    }
    if (local_38 != sVar4) {
      uVar5 = local_38 >> 1 | local_38;
      uVar5 = uVar5 >> 2 | uVar5;
      uVar5 = uVar5 >> 4 | uVar5;
      uVar5 = uVar5 >> 8 | uVar5;
      uVar5 = uVar5 >> 0x10 | uVar5;
      uVar5 = uVar5 >> 0x20 | uVar5;
      bVar8 = 4;
      if ('\x04' < (char)log2(unsigned_long)::table
                         [(uVar5 - (uVar5 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
        bVar8 = log2(unsigned_long)::table[(uVar5 - (uVar5 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
      }
      uVar5 = local_38 + bVar8;
      pSVar1 = (this->
               super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>
               ).storage;
      psVar6 = pSVar1->ptr;
      if (((long)psVar6 - (long)pSVar1 >> 3) * 0x5555555555555555 + 0x10U < uVar5) {
        psVar6 = (sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *)
                 operator_new(uVar5 * 0x18);
      }
      else {
        pSVar1->ptr = psVar6 + uVar5;
      }
      if (psVar6 != psVar6 + local_38 + ((ulong)bVar8 - 1)) {
        lVar7 = 0;
        do {
          (&psVar6->distance_from_desired)[lVar7] = -1;
          lVar7 = lVar7 + 0x18;
        } while ((ulong)((uint)bVar8 * 0x18) + local_38 * 0x18 + -0x18 != lVar7);
      }
      psVar6[local_38 + ((ulong)bVar8 - 1)].distance_from_desired = '\0';
      begin = this->entries;
      sVar4 = this->num_slots_minus_one;
      this->entries = psVar6;
      this->num_slots_minus_one = local_38;
      this->num_slots_minus_one = local_38 - 1;
      (this->hash_policy).shift = iVar3;
      max_lookups = this->max_lookups;
      this->max_lookups = bVar8;
      this->num_elements = 0;
      local_38 = sVar4;
      if (begin != begin + sVar4 + (long)max_lookups) {
        lVar7 = (long)max_lookups * 0x18 + sVar4 * 0x18;
        psVar2 = begin;
        do {
          key = &psVar2->field_1;
          if (-1 < *(char *)((long)&key[-1].value + 8)) {
            sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
            ::emplace<std::pair<slang::BufferID,unsigned_long>>
                      ((sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
                        *)this,&key->value);
            *(undefined1 *)((long)&key[-1].value + 8) = 0xff;
          }
          psVar2 = (EntryPointer)(key + 1);
          lVar7 = lVar7 + -0x18;
        } while (lVar7 != 0);
      }
      deallocate_data(this,begin,local_38,max_lookups);
    }
    return;
  }
  reset_to_empty_state(this);
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }